

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void color_esycc_to_rgb(opj_image_t *image)

{
  byte bVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  opj_image_comp_t *poVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint unaff_R12D;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  
  poVar4 = image->comps;
  bVar1 = (byte)poVar4->prec;
  uVar9 = 1 << (bVar1 - 1 & 0x1f);
  if ((((2 < image->numcomps) && (poVar4->dx == poVar4[1].dx)) && (poVar4->dx == poVar4[2].dx)) &&
     ((poVar4->dy == poVar4[1].dy && (poVar4->dy == poVar4[2].dy)))) {
    OVar2 = poVar4->h;
    OVar3 = poVar4->w;
    uVar11 = 0;
    if (poVar4[1].sgnd == 0) {
      uVar11 = uVar9;
    }
    if (poVar4[2].sgnd != 0) {
      uVar9 = 0;
    }
    uVar10 = ~(-1 << (bVar1 & 0x1f));
    for (uVar12 = 0; OVar2 * OVar3 != uVar12; uVar12 = uVar12 + 1) {
      pOVar5 = poVar4[1].data;
      pOVar6 = poVar4[2].data;
      fVar13 = (float)(int)(pOVar6[uVar12] - uVar9);
      fVar14 = (float)poVar4->data[uVar12];
      fVar15 = (float)(int)(pOVar5[uVar12] - uVar11);
      uVar16 = (uint)(fVar13 * -0.7141128 + fVar14 * 1.0003 + fVar15 * -0.344125 + 0.5);
      uVar17 = (uint)(fVar13 * 1.40199 + fVar15 * -3.68e-05 + fVar14 + 0.5);
      uVar8 = uVar17;
      if ((int)uVar17 < 1) {
        uVar8 = 0;
      }
      auVar7._4_4_ = -(uint)((int)uVar10 < (int)uVar16);
      auVar7._0_4_ = -(uint)((int)uVar10 < (int)uVar16);
      auVar7._8_4_ = -(uint)((int)uVar10 < (int)uVar17);
      auVar7._12_4_ = -(uint)((int)uVar10 < (int)uVar17);
      unaff_R12D = movmskpd(unaff_R12D,auVar7);
      if ((unaff_R12D & 2) != 0) {
        uVar8 = uVar10;
      }
      poVar4->data[uVar12] = uVar8;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      if ((unaff_R12D & 1) != 0) {
        uVar16 = uVar10;
      }
      pOVar5[uVar12] = uVar16;
      uVar8 = (uint)(fVar13 * -8e-06 + fVar14 * 0.999823 + fVar15 * 1.77204 + 0.5);
      uVar16 = 0;
      if (0 < (int)uVar8) {
        uVar16 = uVar8;
      }
      if ((int)uVar10 < (int)uVar8) {
        uVar16 = uVar10;
      }
      pOVar6[uVar12] = uVar16;
    }
    image->color_space = OPJ_CLRSPC_SRGB;
    return;
  }
  fprintf(_stderr,"%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/bin/common/color.c"
          ,0x435);
  return;
}

Assistant:

void color_esycc_to_rgb(opj_image_t *image)
{
    int y, cb, cr, sign1, sign2, val;
    unsigned int w, h, max, i;
    int flip_value = (1 << (image->comps[0].prec - 1));
    int max_value = (1 << image->comps[0].prec) - 1;

    if (
        (image->numcomps < 3)
        || (image->comps[0].dx != image->comps[1].dx) ||
        (image->comps[0].dx != image->comps[2].dx)
        || (image->comps[0].dy != image->comps[1].dy) ||
        (image->comps[0].dy != image->comps[2].dy)
    ) {
        fprintf(stderr, "%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }

    w = image->comps[0].w;
    h = image->comps[0].h;

    sign1 = (int)image->comps[1].sgnd;
    sign2 = (int)image->comps[2].sgnd;

    max = w * h;

    for (i = 0; i < max; ++i) {

        y = image->comps[0].data[i];
        cb = image->comps[1].data[i];
        cr = image->comps[2].data[i];

        if (!sign1) {
            cb -= flip_value;
        }
        if (!sign2) {
            cr -= flip_value;
        }

        val = (int)
              ((float)y - (float)0.0000368 * (float)cb
               + (float)1.40199 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[0].data[i] = val;

        val = (int)
              ((float)1.0003 * (float)y - (float)0.344125 * (float)cb
               - (float)0.7141128 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[1].data[i] = val;

        val = (int)
              ((float)0.999823 * (float)y + (float)1.77204 * (float)cb
               - (float)0.000008 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[2].data[i] = val;
    }
    image->color_space = OPJ_CLRSPC_SRGB;

}